

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce *nonce,secp256k1_ge *ges)

{
  long lVar1;
  
  nonce->data[0] = 0xa8;
  nonce->data[1] = 0xb7;
  nonce->data[2] = 0xe4;
  nonce->data[3] = 'g';
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x40) {
    secp256k1_ge_to_bytes_ext(nonce->data + lVar1 + 4,ges);
    ges = ges + 1;
  }
  return;
}

Assistant:

static void secp256k1_musig_aggnonce_save(secp256k1_musig_aggnonce* nonce, const secp256k1_ge* ges) {
    int i;
    memcpy(&nonce->data[0], secp256k1_musig_aggnonce_magic, 4);
    for (i = 0; i < 2; i++) {
        secp256k1_ge_to_bytes_ext(&nonce->data[4 + 64*i], &ges[i]);
    }
}